

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer pcVar1;
  uint uVar2;
  char *in_R8;
  TimeInMillis local_60;
  string counts;
  string local_38;
  
  if (FLAGS_gtest_print_time == '\x01') {
    uVar2 = TestCase::test_to_run_count(test_case);
    FormatCountableNoun_abi_cxx11_(&counts,(testing *)(ulong)uVar2,0x169b1d,"tests",in_R8);
    ColoredPrintf(COLOR_GREEN,"[----------] ");
    pcVar1 = (test_case->name_)._M_dataplus._M_p;
    local_60 = test_case->elapsed_time_;
    StreamableToString<long_long>(&local_38,&local_60);
    printf("%s from %s (%s ms total)\n\n",counts._M_dataplus._M_p,pcVar1,local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
    fflush(_stdout);
    std::__cxx11::string::~string((string *)&counts);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case.name(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}